

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

iterator __thiscall
spvtools::opt::InlinePass::AddStoresForVariableInitializers
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,DebugInlinedAtContext *inlined_at_ctx,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block_itr)

{
  Instruction *this_00;
  BasicBlock *new_blk_ptr_00;
  InlinePass *pIVar1;
  CommonDebugInfoInstructions CVar2;
  uint32_t uVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  DebugInfoManager *pDVar6;
  pointer line_inst;
  Instruction **ppIVar7;
  long *in_stack_00000010;
  DebugScope local_58;
  mapped_type local_4c;
  iterator local_48;
  InlinePass *local_40;
  DebugInlinedAtContext *local_38;
  
  ppIVar7 = (Instruction **)(*in_stack_00000010 + 0x20);
  local_48.node_ = (Instruction *)this;
  local_40 = (InlinePass *)callee2caller;
  local_38 = (DebugInlinedAtContext *)new_blk_ptr;
  do {
    this_00 = *ppIVar7;
    if (this_00->opcode_ == OpVariable) {
LAB_004f95bb:
      uVar3 = Instruction::NumInOperands(this_00);
      if (uVar3 == 2) {
        uVar3 = Instruction::result_id(this_00);
        local_58.lexical_scope_ = uVar3;
        sVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)inlined_at_ctx,&local_58.lexical_scope_);
        if (sVar4 == 0) {
          ((Pass *)&(local_48.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)->
          _vptr_Pass = (_func_int **)this_00;
          __assert_fail("callee2caller.count(callee_itr->result_id()) && \"Expected the variable to have already been mapped.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp"
                        ,0x144,
                        "InstructionList::iterator spvtools::opt::InlinePass::AddStoresForVariableInitializers(const std::unordered_map<uint32_t, uint32_t> &, analysis::DebugInlinedAtContext *, std::unique_ptr<BasicBlock> *, UptrVectorIterator<BasicBlock>)"
                       );
        }
        local_58.lexical_scope_ = Instruction::result_id(this_00);
        pmVar5 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)inlined_at_ctx,&local_58.lexical_scope_);
        local_4c = *pmVar5;
        uVar3 = Instruction::GetSingleWordInOperand(this_00,1);
        pIVar1 = local_40;
        line_inst = (this_00->dbg_line_insts_).
                    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (line_inst ==
            (this_00->dbg_line_insts_).
            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          line_inst = (Instruction *)0x0;
        }
        pDVar6 = IRContext::get_debug_info_mgr((local_40->super_Pass).context_);
        local_58 = analysis::DebugInfoManager::BuildDebugScope(pDVar6,&this_00->dbg_scope_,local_38)
        ;
        AddStore(pIVar1,local_4c,uVar3,
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)callee_first_block_itr.container_,line_inst,&local_58);
      }
    }
    else {
      CVar2 = Instruction::GetCommonDebugOpcode(this_00);
      if (CVar2 != CommonDebugInfoDebugDeclare) {
        ((local_48.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase = (_func_int **)this_00;
        return (iterator)(iterator)local_48.node_;
      }
      if (this_00->opcode_ == OpVariable) goto LAB_004f95bb;
    }
    CVar2 = Instruction::GetCommonDebugOpcode(this_00);
    pIVar1 = local_40;
    if (CVar2 == CommonDebugInfoDebugDeclare) {
      new_blk_ptr_00 =
           (((_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)&((callee_first_block_itr.container_)->
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->
           super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>)._M_head_impl;
      pDVar6 = IRContext::get_debug_info_mgr((local_40->super_Pass).context_);
      uVar3 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                        (pDVar6,(this_00->dbg_scope_).inlined_at_,local_38);
      InlineSingleInstruction
                (pIVar1,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)inlined_at_ctx,new_blk_ptr_00,this_00,uVar3);
    }
    ppIVar7 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

InstructionList::iterator InlinePass::AddStoresForVariableInitializers(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    analysis::DebugInlinedAtContext* inlined_at_ctx,
    std::unique_ptr<BasicBlock>* new_blk_ptr,
    UptrVectorIterator<BasicBlock> callee_first_block_itr) {
  auto callee_itr = callee_first_block_itr->begin();
  while (callee_itr->opcode() == spv::Op::OpVariable ||
         callee_itr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
    if (callee_itr->opcode() == spv::Op::OpVariable &&
        callee_itr->NumInOperands() == 2) {
      assert(callee2caller.count(callee_itr->result_id()) &&
             "Expected the variable to have already been mapped.");
      uint32_t new_var_id = callee2caller.at(callee_itr->result_id());

      // The initializer must be a constant or global value.  No mapped
      // should be used.
      uint32_t val_id = callee_itr->GetSingleWordInOperand(1);
      AddStore(new_var_id, val_id, new_blk_ptr, callee_itr->dbg_line_inst(),
               context()->get_debug_info_mgr()->BuildDebugScope(
                   callee_itr->GetDebugScope(), inlined_at_ctx));
    }
    if (callee_itr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
      InlineSingleInstruction(
          callee2caller, new_blk_ptr->get(), &*callee_itr,
          context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
              callee_itr->GetDebugScope().GetInlinedAt(), inlined_at_ctx));
    }
    ++callee_itr;
  }
  return callee_itr;
}